

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3ExprBalance(Fts3Expr **pp,int nMaxDepth)

{
  u64 n;
  int iVar1;
  Fts3Expr *pFVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  void *__s;
  long lVar6;
  Fts3Expr **ppFVar7;
  Fts3Expr *pFVar8;
  ulong uVar9;
  Fts3Expr *pFVar10;
  Fts3Expr *p;
  Fts3Expr *pFVar11;
  ulong uVar12;
  bool bVar13;
  Fts3Expr *pLeft;
  Fts3Expr *pRight;
  Fts3Expr *local_60;
  Fts3Expr *local_58;
  ulong local_50;
  Fts3Expr *local_48;
  int local_3c;
  Fts3Expr **local_38;
  
  pFVar10 = *pp;
  if (nMaxDepth == 0) {
    iVar4 = 1;
  }
  else {
    iVar1 = pFVar10->eType;
    if (iVar1 - 3U < 2) {
      n = (long)nMaxDepth * 8;
      local_58 = pFVar10;
      local_50 = (ulong)(uint)nMaxDepth;
      iVar4 = sqlite3_initialize();
      if (iVar4 == 0) {
        __s = sqlite3Malloc(n);
      }
      else {
        __s = (void *)0x0;
      }
      if (__s == (void *)0x0) {
        iVar4 = 7;
        pFVar10 = local_58;
      }
      else {
        memset(__s,0,n);
        iVar4 = local_58->eType;
        local_60 = local_58;
        while (iVar4 == iVar1) {
          local_60 = local_60->pLeft;
          iVar4 = local_60->eType;
        }
        local_3c = (int)local_50 + -1;
        pFVar10 = (Fts3Expr *)0x0;
        local_38 = pp;
        do {
          p = local_60->pParent;
          local_60->pParent = (Fts3Expr *)0x0;
          if (p == (Fts3Expr *)0x0) {
            local_58 = (Fts3Expr *)0x0;
          }
          else {
            p->pLeft = (Fts3Expr *)0x0;
          }
          iVar5 = fts3ExprBalance(&local_60,local_3c);
          if (iVar5 == 0) {
            bVar13 = local_60 != (Fts3Expr *)0x0;
            if (bVar13 && 0 < (int)local_50) {
              lVar6 = 1;
              pFVar8 = local_60;
              do {
                pFVar2 = *(Fts3Expr **)((long)__s + lVar6 * 8 + -8);
                if (pFVar2 == (Fts3Expr *)0x0) {
                  local_60 = (Fts3Expr *)0x0;
                }
                else {
                  pFVar10->pLeft = pFVar2;
                  pFVar10->pRight = pFVar8;
                  pFVar2->pParent = pFVar10;
                  pFVar8->pParent = pFVar10;
                  pFVar2 = pFVar10->pParent;
                  pFVar10->pParent = (Fts3Expr *)0x0;
                  pFVar8 = (Fts3Expr *)0x0;
                  local_60 = pFVar10;
                  pFVar10 = pFVar2;
                }
                *(Fts3Expr **)((long)__s + lVar6 * 8 + -8) = pFVar8;
                bVar13 = local_60 != (Fts3Expr *)0x0;
              } while ((bVar13) &&
                      (bVar3 = lVar6 < nMaxDepth, lVar6 = lVar6 + 1, pFVar8 = local_60, bVar3));
            }
            if (bVar13) {
              sqlite3Fts3ExprFree(local_60);
              iVar5 = 0x12;
              goto LAB_001bcb84;
            }
            iVar4 = 0;
            iVar5 = 0;
            if (p == (Fts3Expr *)0x0) goto LAB_001bcb84;
            ppFVar7 = &p->pRight;
            do {
              local_60 = *ppFVar7;
              ppFVar7 = &local_60->pLeft;
            } while (local_60->eType == iVar1);
            pFVar8 = p->pRight;
            pFVar8->pParent = p->pParent;
            if (p->pParent != (Fts3Expr *)0x0) {
              p->pParent->pLeft = pFVar8;
              pFVar8 = local_58;
            }
            local_58 = pFVar8;
            p->pParent = pFVar10;
            bVar13 = true;
          }
          else {
LAB_001bcb84:
            iVar4 = iVar5;
            p = pFVar10;
            bVar13 = false;
          }
          pFVar10 = p;
        } while (bVar13);
        if (iVar4 == 0) {
          if ((int)local_50 < 1) {
            pFVar10 = (Fts3Expr *)0x0;
            local_60 = pFVar10;
          }
          else {
            uVar9 = 0;
            pFVar8 = (Fts3Expr *)0x0;
            do {
              pFVar2 = *(Fts3Expr **)((long)__s + uVar9 * 8);
              pFVar10 = pFVar8;
              pFVar11 = p;
              if (pFVar2 != (Fts3Expr *)0x0) {
                pFVar10 = pFVar2;
                if (pFVar8 != (Fts3Expr *)0x0) {
                  p->pRight = pFVar8;
                  pFVar10 = *(Fts3Expr **)((long)__s + uVar9 * 8);
                  p->pLeft = pFVar10;
                  pFVar10->pParent = p;
                  pFVar8->pParent = p;
                  pFVar11 = p->pParent;
                  pFVar10 = p;
                }
                pFVar10->pParent = (Fts3Expr *)0x0;
              }
              uVar9 = uVar9 + 1;
              pFVar8 = pFVar10;
              p = pFVar11;
              local_60 = pFVar10;
            } while ((local_50 & 0xffffffff) != uVar9);
          }
        }
        else {
          pFVar10 = local_58;
          if (0 < (int)local_50) {
            uVar9 = local_50 & 0xffffffff;
            uVar12 = 0;
            do {
              sqlite3Fts3ExprFree(*(Fts3Expr **)((long)__s + uVar12 * 8));
              uVar12 = uVar12 + 1;
              pFVar10 = local_58;
            } while (uVar9 != uVar12);
          }
          while (local_58 = pFVar10, p != (Fts3Expr *)0x0) {
            pFVar10 = p->pParent;
            sqlite3_free(p);
            p = pFVar10;
            pFVar10 = local_58;
          }
        }
        sqlite3_free(__s);
        pp = local_38;
      }
    }
    else {
      iVar4 = 0;
      if (iVar1 == 2) {
        local_60 = pFVar10->pLeft;
        local_48 = pFVar10->pRight;
        pFVar10->pLeft = (Fts3Expr *)0x0;
        pFVar10->pRight = (Fts3Expr *)0x0;
        local_60->pParent = (Fts3Expr *)0x0;
        local_48->pParent = (Fts3Expr *)0x0;
        iVar4 = fts3ExprBalance(&local_60,nMaxDepth + -1);
        if (iVar4 == 0) {
          iVar4 = fts3ExprBalance(&local_48,nMaxDepth + -1);
        }
        if (iVar4 == 0) {
          pFVar10->pLeft = local_60;
          local_60->pParent = pFVar10;
          pFVar10->pRight = local_48;
          local_48->pParent = pFVar10;
        }
        else {
          sqlite3Fts3ExprFree(local_48);
          sqlite3Fts3ExprFree(local_60);
        }
      }
    }
  }
  if (iVar4 != 0) {
    sqlite3Fts3ExprFree(pFVar10);
    pFVar10 = (Fts3Expr *)0x0;
  }
  *pp = pFVar10;
  return iVar4;
}

Assistant:

static int fts3ExprBalance(Fts3Expr **pp, int nMaxDepth){
  int rc = SQLITE_OK;             /* Return code */
  Fts3Expr *pRoot = *pp;          /* Initial root node */
  Fts3Expr *pFree = 0;            /* List of free nodes. Linked by pParent. */
  int eType = pRoot->eType;       /* Type of node in this tree */

  if( nMaxDepth==0 ){
    rc = SQLITE_ERROR;
  }

  if( rc==SQLITE_OK ){
    if( (eType==FTSQUERY_AND || eType==FTSQUERY_OR) ){
      Fts3Expr **apLeaf;
      apLeaf = (Fts3Expr **)sqlite3_malloc64(sizeof(Fts3Expr *) * nMaxDepth);
      if( 0==apLeaf ){
        rc = SQLITE_NOMEM;
      }else{
        memset(apLeaf, 0, sizeof(Fts3Expr *) * nMaxDepth);
      }

      if( rc==SQLITE_OK ){
        int i;
        Fts3Expr *p;

        /* Set $p to point to the left-most leaf in the tree of eType nodes. */
        for(p=pRoot; p->eType==eType; p=p->pLeft){
          assert( p->pParent==0 || p->pParent->pLeft==p );
          assert( p->pLeft && p->pRight );
        }

        /* This loop runs once for each leaf in the tree of eType nodes. */
        while( 1 ){
          int iLvl;
          Fts3Expr *pParent = p->pParent;     /* Current parent of p */

          assert( pParent==0 || pParent->pLeft==p );
          p->pParent = 0;
          if( pParent ){
            pParent->pLeft = 0;
          }else{
            pRoot = 0;
          }
          rc = fts3ExprBalance(&p, nMaxDepth-1);
          if( rc!=SQLITE_OK ) break;

          for(iLvl=0; p && iLvl<nMaxDepth; iLvl++){
            if( apLeaf[iLvl]==0 ){
              apLeaf[iLvl] = p;
              p = 0;
            }else{
              assert( pFree );
              pFree->pLeft = apLeaf[iLvl];
              pFree->pRight = p;
              pFree->pLeft->pParent = pFree;
              pFree->pRight->pParent = pFree;

              p = pFree;
              pFree = pFree->pParent;
              p->pParent = 0;
              apLeaf[iLvl] = 0;
            }
          }
          if( p ){
            sqlite3Fts3ExprFree(p);
            rc = SQLITE_TOOBIG;
            break;
          }

          /* If that was the last leaf node, break out of the loop */
          if( pParent==0 ) break;

          /* Set $p to point to the next leaf in the tree of eType nodes */
          for(p=pParent->pRight; p->eType==eType; p=p->pLeft);

          /* Remove pParent from the original tree. */
          assert( pParent->pParent==0 || pParent->pParent->pLeft==pParent );
          pParent->pRight->pParent = pParent->pParent;
          if( pParent->pParent ){
            pParent->pParent->pLeft = pParent->pRight;
          }else{
            assert( pParent==pRoot );
            pRoot = pParent->pRight;
          }

          /* Link pParent into the free node list. It will be used as an
          ** internal node of the new tree.  */
          pParent->pParent = pFree;
          pFree = pParent;
        }

        if( rc==SQLITE_OK ){
          p = 0;
          for(i=0; i<nMaxDepth; i++){
            if( apLeaf[i] ){
              if( p==0 ){
                p = apLeaf[i];
                p->pParent = 0;
              }else{
                assert( pFree!=0 );
                pFree->pRight = p;
                pFree->pLeft = apLeaf[i];
                pFree->pLeft->pParent = pFree;
                pFree->pRight->pParent = pFree;

                p = pFree;
                pFree = pFree->pParent;
                p->pParent = 0;
              }
            }
          }
          pRoot = p;
        }else{
          /* An error occurred. Delete the contents of the apLeaf[] array 
          ** and pFree list. Everything else is cleaned up by the call to
          ** sqlite3Fts3ExprFree(pRoot) below.  */
          Fts3Expr *pDel;
          for(i=0; i<nMaxDepth; i++){
            sqlite3Fts3ExprFree(apLeaf[i]);
          }
          while( (pDel=pFree)!=0 ){
            pFree = pDel->pParent;
            sqlite3_free(pDel);
          }
        }

        assert( pFree==0 );
        sqlite3_free( apLeaf );
      }
    }else if( eType==FTSQUERY_NOT ){
      Fts3Expr *pLeft = pRoot->pLeft;
      Fts3Expr *pRight = pRoot->pRight;

      pRoot->pLeft = 0;
      pRoot->pRight = 0;
      pLeft->pParent = 0;
      pRight->pParent = 0;

      rc = fts3ExprBalance(&pLeft, nMaxDepth-1);
      if( rc==SQLITE_OK ){
        rc = fts3ExprBalance(&pRight, nMaxDepth-1);
      }

      if( rc!=SQLITE_OK ){
        sqlite3Fts3ExprFree(pRight);
        sqlite3Fts3ExprFree(pLeft);
      }else{
        assert( pLeft && pRight );
        pRoot->pLeft = pLeft;
        pLeft->pParent = pRoot;
        pRoot->pRight = pRight;
        pRight->pParent = pRoot;
      }
    }
  }
  
  if( rc!=SQLITE_OK ){
    sqlite3Fts3ExprFree(pRoot);
    pRoot = 0;
  }
  *pp = pRoot;
  return rc;
}